

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-misc.c
# Opt level: O2

_Bool borg_flow_far_from_stairs_dist(wchar_t x,wchar_t y,wchar_t b_stair,wchar_t distance)

{
  wchar_t wVar1;
  
  if (((borg.trait[0x23] < 0x14) && (borg.trait[0x23] + -5 <= borg.trait[0x69])) &&
     (wVar1 = borg_flow_cost_stair(y,x,b_stair), distance < wVar1)) {
    return true;
  }
  return false;
}

Assistant:

bool borg_flow_far_from_stairs_dist(int x, int y, int b_stair, int distance)
{
    if (borg.trait[BI_CDEPTH] >= borg.trait[BI_CLEVEL] - 5
        && borg.trait[BI_CLEVEL] < 20) {

        /* obtain the number of steps from this take to the stairs */
        int cost = borg_flow_cost_stair(y, x, b_stair);

        /* Check the distance to stair for this proposed grid */
        if (cost > distance)
            return true;
    }

    return false;
}